

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::LogBailout(ScriptContext *this,FunctionBody *body,uint kind)

{
  bool bVar1;
  uint *value;
  BailoutStatsMap *this_00;
  uint local_2c;
  uint local_28;
  uint local_24 [2];
  uint kind_local;
  
  local_24[0] = kind;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this->bailoutReasonCounts,local_24);
  if (bVar1) {
    local_28 = JsUtil::
               BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item(this->bailoutReasonCounts,local_24);
    local_28 = local_28 + 1;
    value = &local_28;
    this_00 = this->bailoutReasonCounts;
  }
  else {
    this_00 = this->bailoutReasonCounts;
    value = &local_2c;
    local_2c = 1;
  }
  JsUtil::
  BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_00,local_24,value);
  if (DAT_0145948a == '\x01') {
    LogDataForFunctionBody(this,body,local_24[0],false);
  }
  return;
}

Assistant:

void ScriptContext::LogBailout(Js::FunctionBody *body, uint kind)
    {
        if (!bailoutReasonCounts->ContainsKey(kind))
        {
            bailoutReasonCounts->Item(kind, 1);
        }
        else
        {
            uint val = bailoutReasonCounts->Item(kind);
            ++val;
            bailoutReasonCounts->Item(kind, val);
        }

        if (CONFIG_FLAG(Verbose))
        {
            LogDataForFunctionBody(body, kind, false);
        }
    }